

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  char cVar1;
  bool bVar2;
  GCobj *pGVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((o->field_2).it != 0xfffffff7) {
    return (char *)0x0;
  }
  pGVar3 = (GCobj *)(ulong)(o->u32).lo;
  if ((pGVar3->gch).unused1 == '\0') {
    uVar5 = (ulong)(pGVar3->gch).metatable.gcptr32;
    uVar4 = (uint)*(byte *)(uVar5 - 0x1c);
    bVar2 = idx < uVar4;
    if (uVar4 <= idx) goto LAB_00111a64;
    pGVar3 = (GCobj *)(ulong)*(uint *)((long)pGVar3 + (ulong)idx * 4 + 0x14);
    *tvp = (TValue *)(ulong)(pGVar3->gch).metatable.gcptr32;
    *op = pGVar3;
    pGVar3 = (GCobj *)(ulong)*(uint *)(uVar5 - 8);
    if (pGVar3 != (GCobj *)0x0) {
      if (idx != 0) {
        do {
          do {
            cVar1 = *(char *)pGVar3;
            pGVar3 = (GCobj *)((long)&(pGVar3->gch).nextgc.gcptr32 + 1);
          } while (cVar1 != '\0');
          idx = idx - 1;
        } while (idx != 0);
      }
      goto LAB_00111a64;
    }
  }
  else {
    if ((pGVar3->gch).unused2 <= idx) {
      bVar2 = false;
      goto LAB_00111a64;
    }
    *tvp = (TValue *)((long)pGVar3 + (ulong)idx * 8 + 0x20);
    *op = pGVar3;
    bVar2 = true;
  }
  pGVar3 = (GCobj *)0x15f4f9;
LAB_00111a64:
  if (!bVar2) {
    return (char *)0x0;
  }
  return (char *)pGVar3;
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}